

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFill.cpp
# Opt level: O0

bool __thiscall CDirectiveFill::Load(CDirectiveFill *this,ArgumentList *Args)

{
  Entry *pEVar1;
  size_t sVar2;
  ArgumentList *Args_local;
  CDirectiveFill *this_local;
  
  pEVar1 = ArgumentList::operator[](Args,0);
  initExpression(&this->SizeExpression,&pEVar1->text,false);
  sVar2 = ArgumentList::size(Args);
  if (sVar2 == 2) {
    this->FillByte = true;
    pEVar1 = ArgumentList::operator[](Args,1);
    initExpression(&this->ByteExpression,&pEVar1->text,false);
  }
  else {
    this->FillByte = false;
    this->Byte = 0;
  }
  return true;
}

Assistant:

bool CDirectiveFill::Load(ArgumentList &Args)
{
	initExpression(SizeExpression,Args[0].text);

	if (Args.size() == 2)	// includes fill byte
	{
		FillByte = true;
		initExpression(ByteExpression,Args[1].text);
	} else {
		FillByte = false;
		Byte = 0;
	}

	return true;
}